

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

int t2_encode_packet(opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,uchar *dest,
                    int length,opj_codestream_info_t *cstr_info,int tileno)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  opj_tcd_resolution_t *poVar6;
  opj_tcd_precinct_t *poVar7;
  opj_tcd_cblk_enc_t *poVar8;
  long lVar9;
  opj_packet_info_t *poVar10;
  int iVar11;
  uchar uVar12;
  opj_bio_t *bio;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  opj_tcd_layer_t *poVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  uchar *puVar26;
  bool bVar27;
  double dVar28;
  int local_a8;
  
  iVar3 = pi->resno;
  iVar4 = pi->precno;
  iVar11 = pi->layno;
  lVar19 = (long)iVar11;
  poVar6 = tile->comps[pi->compno].resolutions;
  puVar26 = dest;
  if ((tcp->csty & 2) != 0) {
    dest[0] = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    iVar15 = tile->packno % 0x10000;
    uVar12 = (uchar)((uint)(tile->packno % 0x10000 + 0xff) >> 8);
    if (-1 < iVar15) {
      uVar12 = (uchar)((uint)iVar15 >> 8);
    }
    dest[4] = uVar12;
    dest[5] = (uchar)tile->packno;
    puVar26 = dest + 6;
  }
  if ((iVar11 == 0) && (0 < poVar6[iVar3].numbands)) {
    lVar25 = 0;
    do {
      poVar7 = poVar6[iVar3].bands[lVar25].precincts;
      tgt_reset(poVar7[iVar4].incltree);
      tgt_reset(poVar7[iVar4].imsbtree);
      if (0 < poVar7[iVar4].ch * poVar7[iVar4].cw) {
        lVar24 = 0x30;
        lVar16 = 0;
        do {
          poVar8 = poVar7[iVar4].cblks.enc;
          *(undefined4 *)((long)&poVar8->data + lVar24) = 0;
          tgt_setvalue(poVar7[iVar4].imsbtree,(OPJ_UINT32)lVar16,
                       poVar6[iVar3].bands[lVar25].numbps - *(int *)((long)poVar8 + lVar24 + -8));
          lVar16 = lVar16 + 1;
          lVar24 = lVar24 + 0x40;
        } while (lVar16 < (long)poVar7[iVar4].ch * (long)poVar7[iVar4].cw);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < poVar6[iVar3].numbands);
  }
  bio = bio_create();
  bio_init_enc(bio,puVar26,length);
  bio_write(bio,1,1);
  if (0 < poVar6[iVar3].numbands) {
    lVar25 = 0;
    do {
      poVar7 = poVar6[iVar3].bands[lVar25].precincts;
      if (0 < poVar7[iVar4].ch * poVar7[iVar4].cw) {
        lVar24 = 0x30;
        lVar16 = 0;
        do {
          if ((*(int *)((long)&(poVar7[iVar4].cblks.enc)->data + lVar24) == 0) &&
             (*(int *)(*(long *)((long)poVar7[iVar4].cblks.enc + lVar24 + -0x28) + lVar19 * 0x18) !=
              0)) {
            tgt_setvalue(poVar7[iVar4].incltree,(OPJ_UINT32)lVar16,iVar11);
          }
          lVar16 = lVar16 + 1;
          lVar24 = lVar24 + 0x40;
        } while (lVar16 < (long)poVar7[iVar4].ch * (long)poVar7[iVar4].cw);
      }
      if (0 < poVar7[iVar4].ch * poVar7[iVar4].cw) {
        lVar16 = 0;
        do {
          poVar8 = poVar7[iVar4].cblks.enc;
          poVar17 = poVar8[lVar16].layers + lVar19;
          if (poVar8[lVar16].numpasses == 0) {
            tgt_encode(bio,poVar7[iVar4].incltree,(OPJ_UINT32)lVar16,iVar11 + 1);
          }
          else {
            bio_write(bio,(uint)(poVar17->numpasses != 0),1);
          }
          if (poVar17->numpasses != 0) {
            if (poVar8[lVar16].numpasses == 0) {
              poVar8[lVar16].numlenbits = 3;
              tgt_encode(bio,poVar7[iVar4].imsbtree,(OPJ_UINT32)lVar16,999);
            }
            OVar5 = poVar17->numpasses;
            if (OVar5 == 2) {
              uVar23 = 2;
              iVar15 = 2;
LAB_0013d983:
              bio_write(bio,uVar23,iVar15);
            }
            else {
              if (OVar5 == 1) {
                uVar23 = 0;
                iVar15 = 1;
                goto LAB_0013d983;
              }
              if ((int)OVar5 < 6) {
                uVar23 = OVar5 - 3 | 0xc;
                iVar15 = 4;
                goto LAB_0013d983;
              }
              if ((int)OVar5 < 0x25) {
                uVar23 = OVar5 - 6 | 0x1e0;
                iVar15 = 9;
                goto LAB_0013d983;
              }
              if ((int)OVar5 < 0xa5) {
                uVar23 = OVar5 - 0x25 | 0xff80;
                iVar15 = 0x10;
                goto LAB_0013d983;
              }
            }
            uVar23 = poVar8[lVar16].numpasses;
            lVar24 = (long)(int)uVar23;
            uVar13 = poVar17->numpasses + uVar23;
            uVar22 = 0;
            uVar21 = 0;
            iVar15 = 0;
            if (uVar23 < uVar13) {
              iVar15 = 0;
              uVar22 = 0;
              uVar23 = 0;
              do {
                uVar21 = uVar23 + 1;
                uVar22 = uVar22 + poVar8[lVar16].passes[lVar24].len;
                if ((lVar24 == (int)(uVar13 - 1)) || (poVar8[lVar16].passes[lVar24].term != 0)) {
                  iVar18 = 1;
                  if (1 < (int)uVar22) {
                    do {
                      iVar18 = iVar18 + 1;
                      bVar27 = 3 < uVar22;
                      uVar22 = uVar22 >> 1;
                    } while (bVar27);
                  }
                  uVar22 = 0;
                  iVar20 = 0;
                  if (0 < (int)uVar23) {
                    iVar20 = 0;
                    do {
                      iVar20 = iVar20 + -1;
                      bVar27 = 3 < uVar21;
                      uVar21 = uVar21 >> 1;
                    } while (bVar27);
                  }
                  iVar20 = (iVar18 - poVar8[lVar16].numlenbits) + iVar20;
                  if (iVar15 <= iVar20) {
                    iVar15 = iVar20;
                  }
                  uVar21 = 0;
                }
                lVar24 = lVar24 + 1;
                uVar23 = uVar21;
              } while ((uint)lVar24 < uVar13);
            }
            if (0 < iVar15) {
              iVar18 = iVar15 + 1;
              do {
                bio_write(bio,1,1);
                iVar18 = iVar18 + -1;
              } while (1 < iVar18);
            }
            bio_write(bio,0,1);
            poVar8[lVar16].numlenbits = poVar8[lVar16].numlenbits + iVar15;
            uVar23 = poVar8[lVar16].numpasses;
            lVar24 = (long)(int)uVar23;
            uVar13 = poVar17->numpasses + uVar23;
            if (uVar23 < uVar13) {
              do {
                uVar23 = uVar22 + poVar8[lVar16].passes[lVar24].len;
                if ((uVar13 - 1 == (int)lVar24) ||
                   (uVar13 = uVar21 + 1, uVar22 = uVar23, poVar8[lVar16].passes[lVar24].term != 0))
                {
                  uVar22 = 0;
                  iVar15 = 0;
                  if (0 < (int)uVar21) {
                    iVar15 = 0;
                    uVar14 = (ulong)(uVar21 + 1);
                    do {
                      iVar15 = iVar15 + 1;
                      uVar21 = (uint)uVar14;
                      uVar14 = uVar14 >> 1;
                    } while (3 < uVar21);
                  }
                  bio_write(bio,uVar23,iVar15 + poVar8[lVar16].numlenbits);
                  uVar13 = 0;
                }
                uVar21 = uVar13;
                lVar24 = lVar24 + 1;
                uVar13 = poVar17->numpasses + poVar8[lVar16].numpasses;
              } while ((uint)lVar24 < uVar13);
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < (long)poVar7[iVar4].ch * (long)poVar7[iVar4].cw);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < poVar6[iVar3].numbands);
  }
  iVar11 = bio_flush(bio);
  if (iVar11 == 0) {
    iVar11 = bio_numbytes(bio);
    puVar26 = puVar26 + iVar11;
    bio_destroy(bio);
    if ((tcp->csty & 4) != 0) {
      puVar26[0] = 0xff;
      puVar26[1] = 0x92;
      puVar26 = puVar26 + 2;
    }
    local_a8 = (int)dest;
    if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
      cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos = (long)((int)puVar26 - local_a8)
      ;
    }
    if (0 < poVar6[iVar3].numbands) {
      lVar25 = 0;
      do {
        poVar7 = poVar6[iVar3].bands[lVar25].precincts;
        if (poVar7[iVar4].ch * poVar7[iVar4].cw < 1) {
          bVar27 = true;
        }
        else {
          lVar16 = 0x30;
          lVar24 = 0;
          do {
            poVar8 = poVar7[iVar4].cblks.enc;
            lVar9 = *(long *)((long)poVar8 + lVar16 + -0x28);
            if (*(int *)(lVar9 + lVar19 * 0x18) == 0) {
              iVar11 = 0x1c;
            }
            else {
              piVar1 = (int *)(lVar9 + lVar19 * 0x18);
              iVar11 = 1;
              if (puVar26 + (uint)piVar1[1] <= dest + length) {
                memcpy(puVar26,*(void **)(piVar1 + 4),(ulong)(uint)piVar1[1]);
                piVar2 = (int *)((long)&poVar8->data + lVar16);
                *piVar2 = *piVar2 + *piVar1;
                puVar26 = puVar26 + (uint)piVar1[1];
                iVar11 = 0;
                if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                  poVar10 = cstr_info->tile[tileno].packet;
                  dVar28 = poVar10[cstr_info->packno].disto + *(double *)(piVar1 + 2);
                  poVar10[cstr_info->packno].disto = dVar28;
                  iVar11 = 0;
                  if (cstr_info->D_max <= dVar28 && dVar28 != cstr_info->D_max) {
                    cstr_info->D_max = dVar28;
                  }
                }
              }
            }
            if ((iVar11 != 0x1c) && (iVar11 != 0)) goto LAB_0013dd0c;
            lVar24 = lVar24 + 1;
            lVar16 = lVar16 + 0x40;
          } while (lVar24 < (long)poVar7[iVar4].ch * (long)poVar7[iVar4].cw);
          iVar11 = 0;
LAB_0013dd0c:
          bVar27 = iVar11 == 0;
        }
        if (!bVar27) goto LAB_0013db3f;
        lVar25 = lVar25 + 1;
      } while (lVar25 < poVar6[iVar3].numbands);
    }
    local_a8 = (int)puVar26 - local_a8;
  }
  else {
    bio_destroy(bio);
LAB_0013db3f:
    local_a8 = -999;
  }
  return local_a8;
}

Assistant:

static int t2_encode_packet(opj_tcd_tile_t * tile, opj_tcp_t * tcp, opj_pi_iterator_t *pi, unsigned char *dest, int length, opj_codestream_info_t *cstr_info, int tileno) {
	int bandno, cblkno;
	unsigned char *c = dest;

	int compno = pi->compno;	/* component value */
	int resno  = pi->resno;		/* resolution level value */
	int precno = pi->precno;	/* precinct value */
	int layno  = pi->layno;		/* quality layer value */

	opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
	opj_tcd_resolution_t *res = &tilec->resolutions[resno];
	
	opj_bio_t *bio = NULL;	/* BIO component */
	
	/* <SOP 0xff91> */
	if (tcp->csty & J2K_CP_CSTY_SOP) {
		c[0] = 255;
		c[1] = 145;
		c[2] = 0;
		c[3] = 4;
		c[4] = (unsigned char)((tile->packno % 65536) / 256);
		c[5] = (unsigned char)((tile->packno % 65536) % 256);
		c += 6;
	}
	/* </SOP> */
	
	if (!layno) {
		for (bandno = 0; bandno < res->numbands; bandno++) {
			opj_tcd_band_t *band = &res->bands[bandno];
			opj_tcd_precinct_t *prc = &band->precincts[precno];
			tgt_reset(prc->incltree);
			tgt_reset(prc->imsbtree);
			for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
				opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
				cblk->numpasses = 0;
				tgt_setvalue(prc->imsbtree, cblkno, band->numbps - cblk->numbps);
			}
		}
	}
	
	bio = bio_create();
	bio_init_enc(bio, c, length);
	bio_write(bio, 1, 1);		/* Empty header bit */
	
	/* Writing Packet header */
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!cblk->numpasses && layer->numpasses) {
				tgt_setvalue(prc->incltree, cblkno, layno);
			}
		}
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			int increment = 0;
			int nump = 0;
			int len = 0, passno;
			/* cblk inclusion bits */
			if (!cblk->numpasses) {
				tgt_encode(bio, prc->incltree, cblkno, layno + 1);
			} else {
				bio_write(bio, layer->numpasses != 0, 1);
			}
			/* if cblk not included, go to the next cblk  */
			if (!layer->numpasses) {
				continue;
			}
			/* if first instance of cblk --> zero bit-planes information */
			if (!cblk->numpasses) {
				cblk->numlenbits = 3;
				tgt_encode(bio, prc->imsbtree, cblkno, 999);
			}
			/* number of coding passes included */
			t2_putnumpasses(bio, layer->numpasses);
			
			/* computation of the increase of the length indicator and insertion in the header     */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					increment = int_max(increment, int_floorlog2(len) + 1 - (cblk->numlenbits + int_floorlog2(nump)));
					len = 0;
					nump = 0;
				}
			}
			t2_putcommacode(bio, increment);

			/* computation of the new Length indicator */
			cblk->numlenbits += increment;

			/* insertion of the codeword segment length */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					bio_write(bio, len, cblk->numlenbits + int_floorlog2(nump));
					len = 0;
					nump = 0;
				}
			}
		}
	}

	if (bio_flush(bio)) {
		bio_destroy(bio);
		return -999;		/* modified to eliminate longjmp !! */
	}

	c += bio_numbytes(bio);
	bio_destroy(bio);
	
	/* <EPH 0xff92> */
	if (tcp->csty & J2K_CP_CSTY_EPH) {
		c[0] = 255;
		c[1] = 146;
		c += 2;
	}
	/* </EPH> */

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	// Will be updated later by incrementing with packet start value */
	if(cstr_info && cstr_info->index_write) {
		opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
		info_PK->end_ph_pos = (int)(c - dest);
	}
	/* INDEX >> */
	
	/* Writing the packet body */
	
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!layer->numpasses) {
				continue;
			}
			if (c + layer->len > dest + length) {
				return -999;
			}
			
			memcpy(c, layer->data, layer->len);
			cblk->numpasses += layer->numpasses;
			c += layer->len;
			/* << INDEX */ 
			if(cstr_info && cstr_info->index_write) {
				opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
				info_PK->disto += layer->disto;
				if (cstr_info->D_max < info_PK->disto) {
					cstr_info->D_max = info_PK->disto;
				}
			}
			/* INDEX >> */
		}
	}
	
	return (c - dest);
}